

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  ParseInfoTree *info_tree;
  FieldDescriptor *field_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint uVar4;
  CppType CVar5;
  undefined4 extraout_var;
  Token *pTVar6;
  FileDescriptor *this_00;
  DescriptorPool *pool;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Descriptor *pDVar7;
  string *psVar8;
  LogMessage *other;
  undefined4 extraout_var_03;
  FieldOptions *pFVar9;
  undefined4 extraout_var_04;
  bool local_98b;
  byte local_902;
  FieldDescriptor *local_880;
  bool local_7d1;
  ParseLocation local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  byte local_76b;
  byte local_76a;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  byte local_6a3;
  byte local_6a2;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  undefined1 local_658 [8];
  string tmp;
  string local_630;
  undefined1 local_609;
  undefined1 local_608 [7];
  bool consumed_semicolon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  FieldDescriptor *local_548;
  FieldDescriptor *other_field;
  OneofDescriptor *oneof;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  byte local_4f3;
  byte local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  byte local_4cb;
  byte local_4ca;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  LogFinisher local_47a;
  byte local_479;
  LogMessage local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [8];
  string lower_field_name_1;
  string lower_field_name;
  undefined1 local_2f8 [4];
  int32 field_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [8];
  string serialized_value;
  string local_138;
  allocator<char> local_111;
  string local_110;
  int local_ec;
  undefined1 local_e8 [8];
  string prefix;
  string full_type_name;
  string local_a0;
  FieldDescriptor *local_70;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *message_local;
  ParserImpl *this_local;
  Reflection *reflection_00;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  reflection_00 = (Reflection *)CONCAT44(extraout_var,iVar2);
  field_name.field_2._8_8_ = Message::GetDescriptor(message);
  std::__cxx11::string::string((string *)&field);
  _start_column = (FieldDescriptor *)0x0;
  pTVar6 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._4_4_ = pTVar6->line;
  pTVar6 = io::Tokenizer::current(&this->tokenizer_);
  any_type_url_field._0_4_ = pTVar6->column;
  full_type_name.field_2._M_local_buf[0xe] = '\0';
  full_type_name.field_2._M_local_buf[0xd] = '\0';
  bVar1 = internal::GetAnyFieldDescriptors(message,&any_value_field,&local_70);
  local_7d1 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    full_type_name.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"[",
               (allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf));
    full_type_name.field_2._M_local_buf[0xd] = '\x01';
    local_7d1 = TryConsume(this,&local_a0);
  }
  if ((full_type_name.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((full_type_name.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf))
    ;
  }
  if (local_7d1 != false) {
    std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_e8);
    bVar1 = ConsumeAnyTypeUrl(this,(string *)(prefix.field_2._M_local_buf + 8),(string *)local_e8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"]",&local_111);
      bVar1 = Consume(this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,":",
                   (allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        TryConsume(this,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)local_160);
        pDVar7 = Message::GetDescriptor(message);
        this_00 = Descriptor::file(pDVar7);
        pool = FileDescriptor::pool(this_00);
        bVar1 = ConsumeAnyValue(this,(string *)((long)&prefix.field_2 + 8),pool,(string *)local_160)
        ;
        if (bVar1) {
          if ((this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) ||
             (((bVar1 = FieldDescriptor::is_repeated(any_value_field), bVar1 ||
               (uVar4 = (*reflection_00->_vptr_Reflection[5])(reflection_00,message,any_value_field)
               , (uVar4 & 1) == 0)) &&
              ((bVar1 = FieldDescriptor::is_repeated(local_70), bVar1 ||
               (uVar4 = (*reflection_00->_vptr_Reflection[5])(reflection_00,message,local_70),
               (uVar4 & 1) == 0)))))) {
            std::operator+(&local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&prefix.field_2 + 8));
            (*reflection_00->_vptr_Reflection[0x24])
                      (reflection_00,message,any_value_field,&local_1a8);
            std::__cxx11::string::~string((string *)&local_1a8);
            (*reflection_00->_vptr_Reflection[0x24])(reflection_00,message,local_70,local_160);
            this_local._7_1_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"Non-repeated Any specified multiple times.",&local_181)
            ;
            ReportError(this,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
        local_ec = 1;
        std::__cxx11::string::~string((string *)local_160);
      }
      else {
        this_local._7_1_ = 0;
        local_ec = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_ec = 1;
    }
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
    goto LAB_005a323a;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"[",&local_1c9);
  bVar1 = TryConsume(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  if (bVar1) {
    bVar1 = ConsumeFullTypeName(this,(string *)&field);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"]",&local_1f1);
    bVar1 = Consume(this,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
    if (this->finder_ == (Finder *)0x0) {
      iVar2 = (*reflection_00->_vptr_Reflection[0x4d])(reflection_00,&field);
      local_880 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar2);
    }
    else {
      iVar2 = (*this->finder_->_vptr_Finder[2])(this->finder_,message,&field);
      local_880 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar2);
    }
    _start_column = local_880;
    if (local_880 == (FieldDescriptor *)0x0) {
      if ((this->allow_unknown_field_ & 1U) == 0) {
        std::operator+(&local_278,"Extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
        std::operator+(&local_258,&local_278,"\" is not defined or is not an extension of \"");
        psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        std::operator+(&local_238,&local_258,psVar8);
        std::operator+(&local_218,&local_238,"\".");
        ReportError(this,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        this_local._7_1_ = 0;
        local_ec = 1;
        goto LAB_005a323a;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     "Extension \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     "\" is not defined or is not an extension of \"");
      psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      std::operator+(&local_2b8,&local_2d8,psVar8);
      std::operator+(&local_298,&local_2b8,"\".");
      ReportWarning(this,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
    }
  }
  else {
    bVar1 = ConsumeIdentifier(this,(string *)&field);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
    if (((this->allow_field_number_ & 1U) == 0) ||
       (bVar1 = safe_strto32((string *)&field,(int32 *)(lower_field_name.field_2._M_local_buf + 0xc)
                            ), !bVar1)) {
      _start_column =
           Descriptor::FindFieldByName((Descriptor *)field_name.field_2._8_8_,(string *)&field);
      if (_start_column == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string
                  ((string *)(lower_field_name_1.field_2._M_local_buf + 8),(string *)&field);
        LowerString((string *)((long)&lower_field_name_1.field_2 + 8));
        _start_column =
             Descriptor::FindFieldByName
                       ((Descriptor *)field_name.field_2._8_8_,
                        (string *)((long)&lower_field_name_1.field_2 + 8));
        if ((_start_column != (FieldDescriptor *)0x0) &&
           (TVar3 = FieldDescriptor::type(_start_column), TVar3 != TYPE_GROUP)) {
          _start_column = (FieldDescriptor *)0x0;
        }
        std::__cxx11::string::~string((string *)(lower_field_name_1.field_2._M_local_buf + 8));
      }
      if ((_start_column != (FieldDescriptor *)0x0) &&
         (TVar3 = FieldDescriptor::type(_start_column), TVar3 == TYPE_GROUP)) {
        pDVar7 = FieldDescriptor::message_type(_start_column);
        psVar8 = Descriptor::name_abi_cxx11_(pDVar7);
        bVar1 = std::operator!=(psVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&field);
        if (bVar1) {
          _start_column = (FieldDescriptor *)0x0;
        }
      }
      if ((_start_column == (FieldDescriptor *)0x0) &&
         ((this->allow_case_insensitive_field_ & 1U) != 0)) {
        std::__cxx11::string::string((string *)local_340,(string *)&field);
        LowerString((string *)local_340);
        _start_column =
             Descriptor::FindFieldByLowercaseName
                       ((Descriptor *)field_name.field_2._8_8_,(string *)local_340);
        std::__cxx11::string::~string((string *)local_340);
      }
    }
    else {
      bVar1 = Descriptor::IsExtensionNumber
                        ((Descriptor *)field_name.field_2._8_8_,lower_field_name.field_2._12_4_);
      if (bVar1) {
        iVar2 = (*reflection_00->_vptr_Reflection[0x4e])
                          (reflection_00,(ulong)(uint)lower_field_name.field_2._12_4_);
        _start_column = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar2);
      }
      else {
        _start_column =
             Descriptor::FindFieldByNumber
                       ((Descriptor *)field_name.field_2._8_8_,lower_field_name.field_2._12_4_);
      }
    }
    if (_start_column == (FieldDescriptor *)0x0) {
      if ((this->allow_unknown_field_ & 1U) == 0) {
        psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
        std::operator+(&local_3c0,"Message type \"",psVar8);
        std::operator+(&local_3a0,&local_3c0,"\" has no field named \"");
        std::operator+(&local_380,&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
        std::operator+(&local_360,&local_380,"\".");
        ReportError(this,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        this_local._7_1_ = 0;
        local_ec = 1;
        goto LAB_005a323a;
      }
      psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_name.field_2._8_8_);
      std::operator+(&local_440,"Message type \"",psVar8);
      std::operator+(&local_420,&local_440,"\" has no field named \"");
      std::operator+(&local_400,&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
      std::operator+(&local_3e0,&local_400,"\".");
      ReportWarning(this,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
    }
  }
  if (_start_column == (FieldDescriptor *)0x0) {
    local_479 = 0;
    if ((this->allow_unknown_field_ & 1U) == 0) {
      internal::LogMessage::LogMessage
                (&local_478,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                 ,0x1d9);
      local_479 = 1;
      other = internal::LogMessage::operator<<(&local_478,"CHECK failed: allow_unknown_field_: ");
      internal::LogFinisher::operator=(&local_47a,other);
    }
    if ((local_479 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_478);
    }
    std::allocator<char>::allocator();
    local_4ca = 0;
    local_4cb = 0;
    local_4f2 = 0;
    local_4f3 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,":",&local_4a1);
    bVar1 = TryConsume(this,&local_4a0);
    local_902 = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_4ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"{",&local_4c9);
      local_4cb = 1;
      bVar1 = LookingAt(this,&local_4c8);
      local_902 = 0;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_4f2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"<",&local_4f1);
        local_4f3 = 1;
        bVar1 = LookingAt(this,&local_4f0);
        local_902 = bVar1 ^ 0xff;
      }
    }
    if ((local_4f3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    if ((local_4f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4f1);
    }
    if ((local_4cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    if ((local_4ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_4c9);
    }
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    if ((local_902 & 1) == 0) {
      this_local._7_1_ = SkipFieldMessage(this);
      local_ec = 1;
    }
    else {
      this_local._7_1_ = SkipFieldValue(this);
      local_ec = 1;
    }
    goto LAB_005a323a;
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    bVar1 = FieldDescriptor::is_repeated(_start_column);
    if ((!bVar1) &&
       (uVar4 = (*reflection_00->_vptr_Reflection[5])(reflection_00,message,_start_column),
       (uVar4 & 1) != 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oneof,
                     "Non-repeated field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
      std::operator+(&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oneof,
                     "\" is specified multiple times.");
      ReportError(this,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&oneof);
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
    other_field = (FieldDescriptor *)FieldDescriptor::containing_oneof(_start_column);
    if ((other_field != (FieldDescriptor *)0x0) &&
       (uVar4 = (*reflection_00->_vptr_Reflection[8])(reflection_00,message,other_field),
       (uVar4 & 1) != 0)) {
      iVar2 = (*reflection_00->_vptr_Reflection[10])(reflection_00,message,other_field);
      local_548 = (FieldDescriptor *)CONCAT44(extraout_var_03,iVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                     "Field \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
      std::operator+(&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                     "\" is specified along with field \"");
      psVar8 = FieldDescriptor::name_abi_cxx11_(local_548);
      std::operator+(&local_5c8,&local_5e8,psVar8);
      std::operator+(&local_5a8,&local_5c8,"\", another member of oneof \"");
      psVar8 = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)other_field);
      std::operator+(&local_588,&local_5a8,psVar8);
      std::operator+(&local_568,&local_588,"\".");
      ReportError(this,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)local_608);
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
  }
  CVar5 = FieldDescriptor::cpp_type(_start_column);
  if (CVar5 == CPPTYPE_MESSAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_630,":",(allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
    bVar1 = TryConsume(this,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
    local_609 = bVar1;
    if (!bVar1) goto LAB_005a2acb;
    pFVar9 = FieldDescriptor::options(_start_column);
    bVar1 = FieldOptions::weak(pFVar9);
    if ((!bVar1) || (bVar1 = LookingAtType(this,TYPE_STRING), !bVar1)) goto LAB_005a2acb;
    std::__cxx11::string::string((string *)local_658);
    bVar1 = ConsumeString(this,(string *)local_658);
    if (bVar1) {
      iVar2 = (*reflection_00->_vptr_Reflection[0x27])(reflection_00,message,_start_column,0);
      MessageLite::ParseFromString
                ((MessageLite *)CONCAT44(extraout_var_04,iVar2),(string *)local_658);
      local_ec = 2;
    }
    else {
      this_local._7_1_ = 0;
      local_ec = 1;
    }
    std::__cxx11::string::~string((string *)local_658);
    if (local_ec != 2) goto LAB_005a323a;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,":",&local_679);
    bVar1 = Consume(this,&local_678);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator(&local_679);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_ec = 1;
      goto LAB_005a323a;
    }
LAB_005a2acb:
    local_6a2 = 0;
    local_6a3 = 0;
    bVar1 = FieldDescriptor::is_repeated(_start_column);
    local_98b = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_6a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"[",&local_6a1);
      local_6a3 = 1;
      local_98b = TryConsume(this,&local_6a0);
    }
    if ((local_6a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_6a0);
    }
    if ((local_6a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_6a1);
    }
    if (local_98b == false) {
      CVar5 = FieldDescriptor::cpp_type(_start_column);
      if (CVar5 == CPPTYPE_MESSAGE) {
        bVar1 = ConsumeFieldMessage(this,message,reflection_00,_start_column);
        if (!bVar1) {
          this_local._7_1_ = 0;
          local_ec = 1;
          goto LAB_005a323a;
        }
      }
      else {
        bVar1 = ConsumeFieldValue(this,message,reflection_00,_start_column);
        if (!bVar1) {
          this_local._7_1_ = 0;
          local_ec = 1;
          goto LAB_005a323a;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"]",&local_6c9);
      bVar1 = TryConsume(this,&local_6c8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::allocator<char>::~allocator(&local_6c9);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        do {
          CVar5 = FieldDescriptor::cpp_type(_start_column);
          if (CVar5 == CPPTYPE_MESSAGE) {
            bVar1 = ConsumeFieldMessage(this,message,reflection_00,_start_column);
            if (!bVar1) {
              this_local._7_1_ = 0;
              local_ec = 1;
              goto LAB_005a323a;
            }
          }
          else {
            bVar1 = ConsumeFieldValue(this,message,reflection_00,_start_column);
            if (!bVar1) {
              this_local._7_1_ = 0;
              local_ec = 1;
              goto LAB_005a323a;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"]",&local_6f1);
          bVar1 = TryConsume(this,&local_6f0);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::allocator<char>::~allocator(&local_6f1);
          if (bVar1) goto LAB_005a2f79;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,",",&local_719);
          bVar1 = Consume(this,&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          std::allocator<char>::~allocator(&local_719);
        } while (bVar1);
        this_local._7_1_ = 0;
        local_ec = 1;
        goto LAB_005a323a;
      }
    }
  }
LAB_005a2f79:
  std::allocator<char>::allocator();
  local_76a = 0;
  local_76b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,";",&local_741);
  bVar1 = TryConsume(this,&local_740);
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_76a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,",",&local_769);
    local_76b = 1;
    TryConsume(this,&local_768);
  }
  if ((local_76b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_768);
  }
  if ((local_76a & 1) != 0) {
    std::allocator<char>::~allocator(&local_769);
  }
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  pFVar9 = FieldDescriptor::options(_start_column);
  bVar1 = FieldOptions::deprecated(pFVar9);
  if (bVar1) {
    std::operator+(&local_7b0,"text format contains deprecated field \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
    std::operator+(&local_790,&local_7b0,"\"");
    ReportWarning(this,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
  }
  field_00 = _start_column;
  if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
    info_tree = this->parse_info_tree_;
    ParseLocation::ParseLocation
              (&local_7b8,any_type_url_field._4_4_,(ColumnNumber)any_type_url_field);
    RecordLocation(info_tree,field_00,local_7b8);
  }
  this_local._7_1_ = 1;
  local_ec = 1;
LAB_005a323a:
  std::__cxx11::string::~string((string *)&field);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      string serialized_value;
      DO(ConsumeAnyValue(full_type_name,
                         message->GetDescriptor()->file()->pool(),
                         &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(
          message, any_type_url_field,
          string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ && safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == NULL) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
            field = NULL;
          }
        }
        // Again, special-case group names as described above.
        if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
            && field->message_type()->name() != field_name) {
          field = NULL;
        }

        if (field == NULL && allow_case_insensitive_field_) {
          string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != NULL && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name + "\" is specified along with "
                    "field \"" + other_field->name() + "\", another member "
                    "of oneof \"" + oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() && LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        string tmp;
        DO(ConsumeString(&tmp));
        reflection->MutableMessage(message, field)->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }